

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O2

void printAddrMode2Operand(MCInst *MI,uint Op,SStream *O)

{
  cs_struct *pcVar1;
  cs_detail *pcVar2;
  char *pcVar3;
  _Bool _Var4;
  uint uVar5;
  MCOperand *pMVar6;
  MCOperand *op;
  MCOperand *op_00;
  ulong uVar7;
  int64_t iVar8;
  char *pcVar9;
  
  pMVar6 = MCInst_getOperand(MI,Op);
  _Var4 = MCOperand_isReg(pMVar6);
  if (_Var4) {
    pMVar6 = MCInst_getOperand(MI,Op);
    op = MCInst_getOperand(MI,Op + 1);
    op_00 = MCInst_getOperand(MI,Op + 2);
    uVar7 = MCOperand_getImm(op_00);
    SStream_concat0(O,"[");
    set_mem_access(MI,true);
    pcVar1 = MI->csh;
    uVar5 = MCOperand_getReg(pMVar6);
    printRegName(pcVar1,O,uVar5);
    if (MI->csh->detail != CS_OPT_OFF) {
      uVar5 = MCOperand_getReg(pMVar6);
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x30 + 0x45) = uVar5;
    }
    uVar5 = MCOperand_getReg(op);
    if (uVar5 == 0) {
      uVar7 = MCOperand_getImm(op_00);
      uVar5 = (uint)uVar7 & 0xfff;
      if ((uVar7 & 0xfff) != 0) {
        uVar7 = MCOperand_getImm(op_00);
        SStream_concat0(O,", ");
        pcVar9 = "-";
        if ((uVar7 >> 0xc & 1) == 0) {
          pcVar9 = anon_var_dwarf_350436 + 0x11;
        }
        pcVar3 = ", #%s%u";
        if (9 < uVar5) {
          pcVar3 = ", #%s0x%x";
        }
        SStream_concat(O,pcVar3 + 2,pcVar9,(ulong)uVar5);
        if (MI->csh->detail != CS_OPT_OFF) {
          iVar8 = MCOperand_getImm(op_00);
          pcVar2 = MI->flat_insn->detail;
          *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x30 + 0x39) =
               (uint)(((uint)iVar8 >> 0xc & 1) == 0);
          pcVar2 = MI->flat_insn->detail;
          *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x30 + 0x3d) = uVar5;
          pcVar2 = MI->flat_insn->detail;
          pcVar2->groups[(ulong)(pcVar2->field_6).arm.op_count * 0x30 + 0x5d] =
               (byte)(uVar7 >> 0xc) & 1;
        }
      }
    }
    else {
      SStream_concat0(O,", ");
      pcVar9 = "-";
      if ((uVar7 >> 0xc & 1) == 0) {
        pcVar9 = anon_var_dwarf_350436 + 0x11;
      }
      SStream_concat0(O,pcVar9);
      pcVar1 = MI->csh;
      uVar5 = MCOperand_getReg(op);
      printRegName(pcVar1,O,uVar5);
      if (MI->csh->detail != CS_OPT_OFF) {
        uVar5 = MCOperand_getReg(op);
        pcVar2 = MI->flat_insn->detail;
        *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x30 + 0x49) = uVar5;
        pcVar2 = MI->flat_insn->detail;
        pcVar2->groups[(ulong)(pcVar2->field_6).arm.op_count * 0x30 + 0x5d] =
             (byte)(uVar7 >> 0xc) & 1;
      }
      uVar7 = MCOperand_getImm(op_00);
      iVar8 = MCOperand_getImm(op_00);
      printRegImmShift(MI,O,(ARM_AM_ShiftOpc)(uVar7 >> 0xd) & (ARM_AM_ror|ARM_AM_lsr),
                       (uint)iVar8 & 0xfff);
    }
    SStream_concat0(O,"]");
    set_mem_access(MI,false);
    return;
  }
  printOperand(MI,Op,O);
  return;
}

Assistant:

static void printAddrMode2Operand(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, Op);

	if (!MCOperand_isReg(MO1)) {   // FIXME: This is for CP entries, but isn't right.
		printOperand(MI, Op, O);
		return;
	}

	printAM2PreOrOffsetIndexOp(MI, Op, O);
}